

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_striped_sse41_128_16.c
# Opt level: O1

parasail_result_t *
parasail_nw_stats_striped_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  undefined1 (*pauVar1) [16];
  ushort *puVar2;
  undefined8 *puVar3;
  short *psVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  void *pvVar7;
  void *pvVar8;
  undefined1 auVar9 [16];
  int iVar10;
  short sVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  parasail_result_t *ppVar15;
  __m128i *palVar16;
  __m128i *ptr;
  __m128i *b;
  __m128i *palVar17;
  __m128i *b_00;
  __m128i *ptr_00;
  __m128i *b_01;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *b_02;
  __m128i *b_03;
  __m128i *b_04;
  int16_t *ptr_03;
  ulong uVar18;
  ulong uVar19;
  int16_t iVar20;
  uint uVar21;
  size_t len;
  uint uVar22;
  undefined8 extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  long lVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  __m128i *ptr_04;
  uint uVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  ulong uVar31;
  undefined2 uVar32;
  long lVar33;
  int iVar34;
  bool bVar35;
  undefined4 uVar37;
  undefined4 uVar38;
  ulong uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  ulong uVar49;
  undefined1 auVar53 [16];
  ulong uVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  ulong uVar57;
  ushort uVar58;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  ushort uVar66;
  ushort uVar68;
  undefined1 auVar59 [16];
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  ushort uVar79;
  ushort uVar80;
  ushort uVar81;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  ushort uVar87;
  ushort uVar88;
  ushort uVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  ushort uVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  short sVar100;
  short sVar103;
  short sVar104;
  short sVar105;
  short sVar106;
  short sVar107;
  short sVar108;
  undefined1 auVar101 [16];
  short sVar109;
  undefined1 auVar102 [16];
  short sVar110;
  short sVar113;
  short sVar114;
  short sVar115;
  short sVar116;
  short sVar117;
  short sVar118;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  short sVar119;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i_16_t e;
  __m128i_16_t h;
  __m128i *local_198;
  __m128i *local_188;
  __m128i *local_158;
  undefined8 uStack_150;
  undefined8 local_138;
  undefined8 uStack_130;
  ushort local_c8;
  ushort uStack_c6;
  ushort local_88;
  ushort uStack_86;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  longlong extraout_RDX_00;
  short sVar36;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar50;
  short sVar51;
  short sVar52;
  ushort uVar65;
  ushort uVar67;
  ushort uVar69;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_stats_striped_profile_sse41_128_16_cold_8();
  }
  else {
    pvVar5 = (profile->profile16).score;
    if (pvVar5 == (void *)0x0) {
      parasail_nw_stats_striped_profile_sse41_128_16_cold_7();
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        parasail_nw_stats_striped_profile_sse41_128_16_cold_6();
      }
      else {
        uVar22 = profile->s1Len;
        if ((int)uVar22 < 1) {
          parasail_nw_stats_striped_profile_sse41_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_stats_striped_profile_sse41_128_16_cold_4();
        }
        else {
          uVar18 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_stats_striped_profile_sse41_128_16_cold_3();
          }
          else if (open < 0) {
            parasail_nw_stats_striped_profile_sse41_128_16_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_stats_striped_profile_sse41_128_16_cold_1();
          }
          else {
            iVar25 = uVar22 - 1;
            uVar31 = (ulong)uVar22 + 7 >> 3;
            iVar30 = (int)uVar31;
            uVar22 = iVar25 % iVar30;
            pvVar7 = (profile->profile16).matches;
            pvVar8 = (profile->profile16).similar;
            iVar34 = -open;
            iVar14 = ppVar6->min;
            iVar24 = -iVar14;
            if (iVar14 != iVar34 && SBORROW4(iVar14,iVar34) == iVar14 + open < 0) {
              iVar24 = open;
            }
            iVar10 = ppVar6->max;
            ppVar15 = parasail_result_new_stats();
            if (ppVar15 != (parasail_result_t *)0x0) {
              ppVar15->flag = ppVar15->flag | 0x8210801;
              palVar16 = parasail_memalign___m128i(0x10,uVar31);
              ptr = parasail_memalign___m128i(0x10,uVar31);
              b = parasail_memalign___m128i(0x10,uVar31);
              palVar17 = parasail_memalign___m128i(0x10,uVar31);
              uStack_150 = local_158;
              local_158 = palVar17;
              b_00 = parasail_memalign___m128i(0x10,uVar31);
              ptr_00 = parasail_memalign___m128i(0x10,uVar31);
              b_01 = parasail_memalign___m128i(0x10,uVar31);
              ptr_01 = parasail_memalign___m128i(0x10,uVar31);
              ptr_02 = parasail_memalign___m128i(0x10,uVar31);
              b_02 = parasail_memalign___m128i(0x10,uVar31);
              b_03 = parasail_memalign___m128i(0x10,uVar31);
              b_04 = parasail_memalign___m128i(0x10,uVar31);
              ptr_03 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
              c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              c[1]._0_1_ = (b_03 == (__m128i *)0x0 ||
                           (b_02 == (__m128i *)0x0 ||
                           (ptr_02 == (__m128i *)0x0 || ptr_01 == (__m128i *)0x0))) ||
                           ((b_01 == (__m128i *)0x0 ||
                            (ptr_00 == (__m128i *)0x0 || b_00 == (__m128i *)0x0)) ||
                           ((palVar17 == (__m128i *)0x0 || b == (__m128i *)0x0) ||
                           (ptr == (__m128i *)0x0 || palVar16 == (__m128i *)0x0)));
              len = CONCAT71((int7)((ulong)palVar16 >> 8),
                             (ptr_03 == (int16_t *)0x0 || b_04 == (__m128i *)0x0) || c[1]._0_1_);
              if ((ptr_03 != (int16_t *)0x0 && b_04 != (__m128i *)0x0) &&
                  ((b_03 != (__m128i *)0x0 &&
                   (b_02 != (__m128i *)0x0 && (ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0)
                   )) && ((b_01 != (__m128i *)0x0 &&
                          (ptr_00 != (__m128i *)0x0 && b_00 != (__m128i *)0x0)) &&
                         ((palVar17 != (__m128i *)0x0 && b != (__m128i *)0x0) &&
                         (ptr != (__m128i *)0x0 && palVar16 != (__m128i *)0x0))))) {
                iVar12 = s2Len + -1;
                iVar13 = 7 - iVar25 / iVar30;
                auVar40 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
                uVar37 = auVar40._0_4_;
                auVar40 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
                uVar38 = auVar40._0_4_;
                auVar40 = pshuflw(ZEXT416(iVar24 - 0x7fff),ZEXT416(iVar24 - 0x7fff),0);
                local_c8 = auVar40._0_2_;
                uStack_c6 = auVar40._2_2_;
                auVar41 = ZEXT416(CONCAT22((short)((uint)iVar14 >> 0x10),0x7ffe - (short)iVar10));
                auVar41 = pshuflw(auVar41,auVar41,0);
                c[0] = uVar31;
                parasail_memset___m128i(b,c,len);
                c_00[1] = extraout_RDX_00;
                c_00[0] = uVar31;
                parasail_memset___m128i(b_00,c_00,len);
                c_01[1] = extraout_RDX_01;
                c_01[0] = uVar31;
                parasail_memset___m128i(b_01,c_01,len);
                c_02[1] = extraout_RDX_02;
                c_02[0] = uVar31;
                parasail_memset___m128i(b_02,c_02,len);
                c_03[1] = extraout_RDX_03;
                c_03[0] = uVar31;
                parasail_memset___m128i(b_03,c_03,len);
                pmovsxbw(extraout_XMM0,0x101010101010101);
                c_04[1] = extraout_RDX_04;
                c_04[0] = uVar31;
                parasail_memset___m128i(b_04,c_04,len);
                lVar23 = (long)iVar34;
                uVar26 = 0;
                do {
                  lVar29 = 0;
                  lVar28 = lVar23;
                  do {
                    uVar32 = 0x8000;
                    if (-0x8000 < lVar28) {
                      uVar32 = (undefined2)lVar28;
                    }
                    *(undefined2 *)((long)&local_48 + lVar29 * 2) = uVar32;
                    lVar33 = lVar28 - (ulong)(uint)open;
                    if (lVar33 < -0x7fff) {
                      lVar33 = -0x8000;
                    }
                    *(short *)((long)&local_58 + lVar29 * 2) = (short)lVar33;
                    lVar29 = lVar29 + 1;
                    lVar28 = lVar28 - uVar31 * (uint)gap;
                  } while (lVar29 != 8);
                  palVar16[uVar26][0] = local_48;
                  palVar16[uVar26][1] = lStack_40;
                  ptr_02[uVar26][0] = local_58;
                  ptr_02[uVar26][1] = lStack_50;
                  uVar26 = uVar26 + 1;
                  lVar23 = lVar23 - (ulong)(uint)gap;
                } while (uVar26 != uVar31);
                *ptr_03 = 0;
                uVar26 = 1;
                do {
                  iVar20 = -0x8000;
                  if (-0x8000 < iVar34) {
                    iVar20 = (int16_t)iVar34;
                  }
                  ptr_03[uVar26] = iVar20;
                  uVar26 = uVar26 + 1;
                  iVar34 = iVar34 - gap;
                } while (s2Len + 1 != uVar26);
                uVar21 = iVar30 - 1;
                if (s2Len < 2) {
                  uVar18 = 1;
                }
                lVar23 = (ulong)(iVar30 + (uint)(iVar30 == 0)) << 4;
                uVar26 = 0;
                local_88 = auVar41._0_2_;
                uStack_86 = auVar41._2_2_;
                uVar70 = local_88;
                uVar71 = uStack_86;
                uVar72 = local_88;
                uVar73 = uStack_86;
                uVar74 = local_88;
                uVar75 = uStack_86;
                uVar76 = local_88;
                uVar77 = uStack_86;
                uVar78 = local_c8;
                uVar79 = uStack_c6;
                uVar80 = local_c8;
                uVar82 = uStack_c6;
                uVar83 = local_c8;
                uVar85 = uStack_c6;
                uVar86 = local_c8;
                uVar88 = uStack_c6;
                do {
                  local_188 = ptr_01;
                  local_198 = ptr_00;
                  ptr_04 = b;
                  palVar17 = ptr;
                  ptr_01 = b_01;
                  ptr_00 = b_00;
                  ptr = palVar16;
                  b = local_158;
                  uVar57 = ptr[uVar21][0];
                  uVar19 = ptr_04[uVar21][0];
                  uVar54 = ptr_00[uVar21][0];
                  uVar39 = ptr_01[uVar21][0];
                  auVar97._0_8_ = uVar19 << 0x10;
                  auVar97._8_8_ = ptr_04[uVar21][1] << 0x10 | uVar19 >> 0x30;
                  auVar96._0_8_ = uVar54 << 0x10;
                  auVar96._8_8_ = ptr_00[uVar21][1] << 0x10 | uVar54 >> 0x30;
                  auVar101._0_8_ = uVar39 << 0x10;
                  auVar101._8_8_ = ptr_01[uVar21][1] << 0x10 | uVar39 >> 0x30;
                  auVar41._8_8_ = ptr[uVar21][1] << 0x10 | uVar57 >> 0x30;
                  auVar41._0_8_ = uVar57 << 0x10 | (ulong)(ushort)ptr_03[uVar26];
                  lVar29 = (long)ppVar6->mapper[(byte)s2[uVar26]] * uVar31 * 0x10;
                  auVar90 = (undefined1  [16])0x0;
                  lVar28 = 0;
                  in_XMM7 = pmovsxbw(in_XMM7,0x101010101010101);
                  auVar92 = (undefined1  [16])0x0;
                  auVar112._4_2_ = local_c8;
                  auVar112._0_4_ = auVar40._0_4_;
                  auVar112._6_2_ = uStack_c6;
                  auVar112._8_2_ = local_c8;
                  auVar112._10_2_ = uStack_c6;
                  auVar112._12_2_ = local_c8;
                  auVar112._14_2_ = uStack_c6;
                  do {
                    auVar41 = paddsw(auVar41,*(undefined1 (*) [16])((long)pvVar5 + lVar28 + lVar29))
                    ;
                    pauVar1 = (undefined1 (*) [16])((long)*ptr_02 + lVar28);
                    sVar11 = *(short *)*pauVar1;
                    sVar36 = *(short *)(*pauVar1 + 2);
                    sVar45 = *(short *)(*pauVar1 + 4);
                    sVar46 = *(short *)(*pauVar1 + 6);
                    sVar47 = *(short *)(*pauVar1 + 8);
                    sVar48 = *(short *)(*pauVar1 + 10);
                    sVar50 = *(short *)(*pauVar1 + 0xc);
                    sVar51 = *(short *)(*pauVar1 + 0xe);
                    auVar42 = *pauVar1;
                    uVar81 = auVar41._0_2_;
                    uVar58 = (ushort)((short)uVar81 < sVar11) * sVar11 |
                             ((short)uVar81 >= sVar11) * uVar81;
                    uVar84 = auVar41._2_2_;
                    uVar60 = (ushort)((short)uVar84 < sVar36) * sVar36 |
                             ((short)uVar84 >= sVar36) * uVar84;
                    uVar87 = auVar41._4_2_;
                    uVar61 = (ushort)((short)uVar87 < sVar45) * sVar45 |
                             ((short)uVar87 >= sVar45) * uVar87;
                    uVar89 = auVar41._6_2_;
                    uVar62 = (ushort)((short)uVar89 < sVar46) * sVar46 |
                             ((short)uVar89 >= sVar46) * uVar89;
                    uVar95 = auVar41._8_2_;
                    uVar63 = (ushort)((short)uVar95 < sVar47) * sVar47 |
                             ((short)uVar95 >= sVar47) * uVar95;
                    uVar65 = auVar41._10_2_;
                    uVar64 = (ushort)((short)uVar65 < sVar48) * sVar48 |
                             ((short)uVar65 >= sVar48) * uVar65;
                    uVar67 = auVar41._12_2_;
                    uVar69 = auVar41._14_2_;
                    uVar66 = (ushort)((short)uVar67 < sVar50) * sVar50 |
                             ((short)uVar67 >= sVar50) * uVar67;
                    uVar68 = (ushort)((short)uVar69 < sVar51) * sVar51 |
                             ((short)uVar69 >= sVar51) * uVar69;
                    sVar11 = auVar112._0_2_;
                    auVar55._0_2_ =
                         (ushort)((short)uVar58 < sVar11) * sVar11 |
                         ((short)uVar58 >= sVar11) * uVar58;
                    sVar36 = auVar112._2_2_;
                    auVar55._2_2_ =
                         (ushort)((short)uVar60 < sVar36) * sVar36 |
                         ((short)uVar60 >= sVar36) * uVar60;
                    sVar45 = auVar112._4_2_;
                    auVar55._4_2_ =
                         (ushort)((short)uVar61 < sVar45) * sVar45 |
                         ((short)uVar61 >= sVar45) * uVar61;
                    sVar46 = auVar112._6_2_;
                    auVar55._6_2_ =
                         (ushort)((short)uVar62 < sVar46) * sVar46 |
                         ((short)uVar62 >= sVar46) * uVar62;
                    sVar47 = auVar112._8_2_;
                    auVar55._8_2_ =
                         (ushort)((short)uVar63 < sVar47) * sVar47 |
                         ((short)uVar63 >= sVar47) * uVar63;
                    sVar48 = auVar112._10_2_;
                    auVar55._10_2_ =
                         (ushort)((short)uVar64 < sVar48) * sVar48 |
                         ((short)uVar64 >= sVar48) * uVar64;
                    sVar50 = auVar112._12_2_;
                    auVar55._12_2_ =
                         (ushort)((short)uVar66 < sVar50) * sVar50 |
                         ((short)uVar66 >= sVar50) * uVar66;
                    sVar51 = auVar112._14_2_;
                    auVar55._14_2_ =
                         (ushort)((short)uVar68 < sVar51) * sVar51 |
                         ((short)uVar68 >= sVar51) * uVar68;
                    auVar41 = *(undefined1 (*) [16])((long)*b_02 + lVar28);
                    auVar102 = *(undefined1 (*) [16])((long)*b_03 + lVar28);
                    pauVar1 = (undefined1 (*) [16])((long)*b_04 + lVar28);
                    auVar9 = *pauVar1;
                    auVar99 = *pauVar1;
                    *(undefined1 (*) [16])((long)*palVar17 + lVar28) = auVar55;
                    auVar111._0_2_ = -(ushort)(sVar11 < (short)uVar58);
                    auVar111._2_2_ = -(ushort)(sVar36 < (short)uVar60);
                    auVar111._4_2_ = -(ushort)(sVar45 < (short)uVar61);
                    auVar111._6_2_ = -(ushort)(sVar46 < (short)uVar62);
                    auVar111._8_2_ = -(ushort)(sVar47 < (short)uVar63);
                    auVar111._10_2_ = -(ushort)(sVar48 < (short)uVar64);
                    auVar111._12_2_ = -(ushort)(sVar50 < (short)uVar66);
                    auVar111._14_2_ = -(ushort)(sVar51 < (short)uVar68);
                    auVar93 = pblendvb(auVar92,auVar41,auVar111);
                    auVar97 = paddsw(auVar97,*(undefined1 (*) [16])((long)pvVar7 + lVar28 + lVar29))
                    ;
                    auVar53._0_2_ = -(ushort)(uVar81 == auVar55._0_2_);
                    auVar53._2_2_ = -(ushort)(uVar84 == auVar55._2_2_);
                    auVar53._4_2_ = -(ushort)(uVar87 == auVar55._4_2_);
                    auVar53._6_2_ = -(ushort)(uVar89 == auVar55._6_2_);
                    auVar53._8_2_ = -(ushort)(uVar95 == auVar55._8_2_);
                    auVar53._10_2_ = -(ushort)(uVar65 == auVar55._10_2_);
                    auVar53._12_2_ = -(ushort)(uVar67 == auVar55._12_2_);
                    auVar53._14_2_ = -(ushort)(uVar69 == auVar55._14_2_);
                    auVar94 = pblendvb(auVar93,auVar97,auVar53);
                    *(undefined1 (*) [16])((long)*b + lVar28) = auVar94;
                    auVar93 = pblendvb(auVar90,auVar102,auVar111);
                    auVar97 = paddsw(auVar96,*(undefined1 (*) [16])((long)pvVar8 + lVar28 + lVar29))
                    ;
                    auVar98 = pblendvb(auVar93,auVar97,auVar53);
                    *(undefined1 (*) [16])((long)*local_198 + lVar28) = auVar98;
                    auVar96 = pblendvb(in_XMM7,auVar99,auVar111);
                    auVar97 = pmovsxbw(auVar111,0x101010101010101);
                    auVar111 = paddsw(auVar101,auVar97);
                    auVar96 = pblendvb(auVar96,auVar111,auVar53);
                    *(undefined1 (*) [16])((long)*local_188 + lVar28) = auVar96;
                    uVar70 = ((short)auVar55._0_2_ < (short)uVar70) * auVar55._0_2_ |
                             ((short)auVar55._0_2_ >= (short)uVar70) * uVar70;
                    uVar71 = ((short)auVar55._2_2_ < (short)uVar71) * auVar55._2_2_ |
                             ((short)auVar55._2_2_ >= (short)uVar71) * uVar71;
                    uVar72 = ((short)auVar55._4_2_ < (short)uVar72) * auVar55._4_2_ |
                             ((short)auVar55._4_2_ >= (short)uVar72) * uVar72;
                    uVar73 = ((short)auVar55._6_2_ < (short)uVar73) * auVar55._6_2_ |
                             ((short)auVar55._6_2_ >= (short)uVar73) * uVar73;
                    uVar74 = ((short)auVar55._8_2_ < (short)uVar74) * auVar55._8_2_ |
                             ((short)auVar55._8_2_ >= (short)uVar74) * uVar74;
                    uVar75 = ((short)auVar55._10_2_ < (short)uVar75) * auVar55._10_2_ |
                             ((short)auVar55._10_2_ >= (short)uVar75) * uVar75;
                    uVar76 = ((short)auVar55._12_2_ < (short)uVar76) * auVar55._12_2_ |
                             ((short)auVar55._12_2_ >= (short)uVar76) * uVar76;
                    uVar77 = ((short)auVar55._14_2_ < (short)uVar77) * auVar55._14_2_ |
                             ((short)auVar55._14_2_ >= (short)uVar77) * uVar77;
                    uVar78 = ((short)uVar78 < (short)auVar55._0_2_) * auVar55._0_2_ |
                             ((short)uVar78 >= (short)auVar55._0_2_) * uVar78;
                    uVar58 = ((short)uVar79 < (short)auVar55._2_2_) * auVar55._2_2_ |
                             ((short)uVar79 >= (short)auVar55._2_2_) * uVar79;
                    uVar81 = ((short)uVar80 < (short)auVar55._4_2_) * auVar55._4_2_ |
                             ((short)uVar80 >= (short)auVar55._4_2_) * uVar80;
                    uVar60 = ((short)uVar82 < (short)auVar55._6_2_) * auVar55._6_2_ |
                             ((short)uVar82 >= (short)auVar55._6_2_) * uVar82;
                    uVar84 = ((short)uVar83 < (short)auVar55._8_2_) * auVar55._8_2_ |
                             ((short)uVar83 >= (short)auVar55._8_2_) * uVar83;
                    uVar61 = ((short)uVar85 < (short)auVar55._10_2_) * auVar55._10_2_ |
                             ((short)uVar85 >= (short)auVar55._10_2_) * uVar85;
                    uVar87 = ((short)uVar86 < (short)auVar55._12_2_) * auVar55._12_2_ |
                             ((short)uVar86 >= (short)auVar55._12_2_) * uVar86;
                    uVar62 = ((short)uVar88 < (short)auVar55._14_2_) * auVar55._14_2_ |
                             ((short)uVar88 >= (short)auVar55._14_2_) * uVar88;
                    sVar11 = auVar96._0_2_;
                    sVar36 = auVar98._0_2_;
                    uVar79 = (ushort)(sVar36 < sVar11) * sVar11 |
                             (ushort)(sVar36 >= sVar11) * sVar36;
                    sVar11 = auVar96._2_2_;
                    sVar36 = auVar98._2_2_;
                    uVar80 = (ushort)(sVar36 < sVar11) * sVar11 |
                             (ushort)(sVar36 >= sVar11) * sVar36;
                    sVar11 = auVar96._4_2_;
                    sVar36 = auVar98._4_2_;
                    uVar82 = (ushort)(sVar36 < sVar11) * sVar11 |
                             (ushort)(sVar36 >= sVar11) * sVar36;
                    sVar11 = auVar96._6_2_;
                    sVar36 = auVar98._6_2_;
                    uVar83 = (ushort)(sVar36 < sVar11) * sVar11 |
                             (ushort)(sVar36 >= sVar11) * sVar36;
                    sVar11 = auVar96._8_2_;
                    sVar36 = auVar98._8_2_;
                    uVar85 = (ushort)(sVar36 < sVar11) * sVar11 |
                             (ushort)(sVar36 >= sVar11) * sVar36;
                    sVar11 = auVar96._10_2_;
                    sVar36 = auVar98._10_2_;
                    uVar86 = (ushort)(sVar36 < sVar11) * sVar11 |
                             (ushort)(sVar36 >= sVar11) * sVar36;
                    sVar11 = auVar96._12_2_;
                    sVar36 = auVar98._12_2_;
                    sVar45 = auVar98._14_2_;
                    uVar88 = (ushort)(sVar36 < sVar11) * sVar11 |
                             (ushort)(sVar36 >= sVar11) * sVar36;
                    sVar11 = auVar96._14_2_;
                    uVar89 = (ushort)(sVar45 < sVar11) * sVar11 |
                             (ushort)(sVar45 >= sVar11) * sVar45;
                    auVar93._4_4_ = uVar37;
                    auVar93._0_4_ = uVar37;
                    auVar93._8_4_ = uVar37;
                    auVar93._12_4_ = uVar37;
                    auVar97 = psubsw(auVar55,auVar93);
                    auVar99._4_4_ = uVar38;
                    auVar99._0_4_ = uVar38;
                    auVar99._8_4_ = uVar38;
                    auVar99._12_4_ = uVar38;
                    auVar101 = psubsw(auVar42,auVar99);
                    sVar36 = auVar97._0_2_;
                    sVar100 = auVar101._0_2_;
                    auVar42._0_2_ = -(ushort)(sVar100 < sVar36);
                    sVar45 = auVar97._2_2_;
                    sVar103 = auVar101._2_2_;
                    auVar42._2_2_ = -(ushort)(sVar103 < sVar45);
                    sVar46 = auVar97._4_2_;
                    sVar104 = auVar101._4_2_;
                    auVar42._4_2_ = -(ushort)(sVar104 < sVar46);
                    sVar47 = auVar97._6_2_;
                    sVar105 = auVar101._6_2_;
                    auVar42._6_2_ = -(ushort)(sVar105 < sVar47);
                    sVar48 = auVar97._8_2_;
                    sVar106 = auVar101._8_2_;
                    auVar42._8_2_ = -(ushort)(sVar106 < sVar48);
                    sVar50 = auVar97._10_2_;
                    sVar107 = auVar101._10_2_;
                    auVar42._10_2_ = -(ushort)(sVar107 < sVar50);
                    sVar51 = auVar97._12_2_;
                    sVar108 = auVar101._12_2_;
                    sVar52 = auVar97._14_2_;
                    auVar42._12_2_ = -(ushort)(sVar108 < sVar51);
                    sVar109 = auVar101._14_2_;
                    auVar42._14_2_ = -(ushort)(sVar109 < sVar52);
                    auVar41 = pblendvb(auVar41,auVar94,auVar42);
                    auVar101 = pblendvb(auVar102,auVar98,auVar42);
                    auVar97 = pmovsxbw(auVar111,0x101010101010101);
                    auVar102 = paddsw(auVar9,auVar97);
                    auVar97 = paddsw(auVar96,auVar97);
                    auVar96 = pblendvb(auVar102,auVar97,auVar42);
                    auVar112 = psubsw(auVar112,auVar99);
                    sVar110 = auVar112._0_2_;
                    auVar102._0_2_ = -(ushort)(sVar110 < sVar36);
                    sVar113 = auVar112._2_2_;
                    auVar102._2_2_ = -(ushort)(sVar113 < sVar45);
                    sVar114 = auVar112._4_2_;
                    auVar102._4_2_ = -(ushort)(sVar114 < sVar46);
                    sVar115 = auVar112._6_2_;
                    auVar102._6_2_ = -(ushort)(sVar115 < sVar47);
                    sVar116 = auVar112._8_2_;
                    auVar102._8_2_ = -(ushort)(sVar116 < sVar48);
                    sVar117 = auVar112._10_2_;
                    auVar102._10_2_ = -(ushort)(sVar117 < sVar50);
                    sVar118 = auVar112._12_2_;
                    auVar102._12_2_ = -(ushort)(sVar118 < sVar51);
                    sVar119 = auVar112._14_2_;
                    auVar102._14_2_ = -(ushort)(sVar119 < sVar52);
                    auVar92 = pblendvb(auVar92,auVar94,auVar102);
                    sVar11 = auVar94._0_2_;
                    uVar78 = (ushort)((short)uVar78 < sVar11) * sVar11 |
                             ((short)uVar78 >= sVar11) * uVar78;
                    sVar11 = auVar94._2_2_;
                    uVar58 = (ushort)((short)uVar58 < sVar11) * sVar11 |
                             ((short)uVar58 >= sVar11) * uVar58;
                    sVar11 = auVar94._4_2_;
                    uVar81 = (ushort)((short)uVar81 < sVar11) * sVar11 |
                             ((short)uVar81 >= sVar11) * uVar81;
                    sVar11 = auVar94._6_2_;
                    uVar60 = (ushort)((short)uVar60 < sVar11) * sVar11 |
                             ((short)uVar60 >= sVar11) * uVar60;
                    sVar11 = auVar94._8_2_;
                    uVar84 = (ushort)((short)uVar84 < sVar11) * sVar11 |
                             ((short)uVar84 >= sVar11) * uVar84;
                    sVar11 = auVar94._10_2_;
                    uVar61 = (ushort)((short)uVar61 < sVar11) * sVar11 |
                             ((short)uVar61 >= sVar11) * uVar61;
                    sVar11 = auVar94._12_2_;
                    uVar87 = (ushort)((short)uVar87 < sVar11) * sVar11 |
                             ((short)uVar87 >= sVar11) * uVar87;
                    sVar11 = auVar94._14_2_;
                    uVar62 = (ushort)((short)uVar62 < sVar11) * sVar11 |
                             ((short)uVar62 >= sVar11) * uVar62;
                    uVar78 = ((short)uVar79 < (short)uVar78) * uVar78 |
                             ((short)uVar79 >= (short)uVar78) * uVar79;
                    uVar79 = ((short)uVar80 < (short)uVar58) * uVar58 |
                             ((short)uVar80 >= (short)uVar58) * uVar80;
                    uVar80 = ((short)uVar82 < (short)uVar81) * uVar81 |
                             ((short)uVar82 >= (short)uVar81) * uVar82;
                    uVar82 = ((short)uVar83 < (short)uVar60) * uVar60 |
                             ((short)uVar83 >= (short)uVar60) * uVar83;
                    uVar83 = ((short)uVar85 < (short)uVar84) * uVar84 |
                             ((short)uVar85 >= (short)uVar84) * uVar85;
                    uVar85 = ((short)uVar86 < (short)uVar61) * uVar61 |
                             ((short)uVar86 >= (short)uVar61) * uVar86;
                    uVar86 = ((short)uVar88 < (short)uVar87) * uVar87 |
                             ((short)uVar88 >= (short)uVar87) * uVar88;
                    uVar88 = ((short)uVar89 < (short)uVar62) * uVar62 |
                             ((short)uVar89 >= (short)uVar62) * uVar89;
                    puVar2 = (ushort *)((long)*ptr_02 + lVar28);
                    *puVar2 = (ushort)(sVar36 < sVar100) * sVar100 |
                              (ushort)(sVar36 >= sVar100) * sVar36;
                    puVar2[1] = (ushort)(sVar45 < sVar103) * sVar103 |
                                (ushort)(sVar45 >= sVar103) * sVar45;
                    puVar2[2] = (ushort)(sVar46 < sVar104) * sVar104 |
                                (ushort)(sVar46 >= sVar104) * sVar46;
                    puVar2[3] = (ushort)(sVar47 < sVar105) * sVar105 |
                                (ushort)(sVar47 >= sVar105) * sVar47;
                    puVar2[4] = (ushort)(sVar48 < sVar106) * sVar106 |
                                (ushort)(sVar48 >= sVar106) * sVar48;
                    puVar2[5] = (ushort)(sVar50 < sVar107) * sVar107 |
                                (ushort)(sVar50 >= sVar107) * sVar50;
                    puVar2[6] = (ushort)(sVar51 < sVar108) * sVar108 |
                                (ushort)(sVar51 >= sVar108) * sVar51;
                    puVar2[7] = (ushort)(sVar52 < sVar109) * sVar109 |
                                (ushort)(sVar52 >= sVar109) * sVar52;
                    local_158 = auVar41._0_8_;
                    uStack_150 = auVar41._8_8_;
                    puVar3 = (undefined8 *)((long)*b_02 + lVar28);
                    *puVar3 = local_158;
                    puVar3[1] = uStack_150;
                    local_138 = auVar101._0_8_;
                    uStack_130 = auVar101._8_8_;
                    puVar3 = (undefined8 *)((long)*b_03 + lVar28);
                    *puVar3 = local_138;
                    puVar3[1] = uStack_130;
                    *(undefined1 (*) [16])((long)*b_04 + lVar28) = auVar96;
                    auVar112._0_2_ =
                         (ushort)(sVar36 < sVar110) * sVar110 | (ushort)(sVar36 >= sVar110) * sVar36
                    ;
                    auVar112._2_2_ =
                         (ushort)(sVar45 < sVar113) * sVar113 | (ushort)(sVar45 >= sVar113) * sVar45
                    ;
                    auVar112._4_2_ =
                         (ushort)(sVar46 < sVar114) * sVar114 | (ushort)(sVar46 >= sVar114) * sVar46
                    ;
                    auVar112._6_2_ =
                         (ushort)(sVar47 < sVar115) * sVar115 | (ushort)(sVar47 >= sVar115) * sVar47
                    ;
                    auVar112._8_2_ =
                         (ushort)(sVar48 < sVar116) * sVar116 | (ushort)(sVar48 >= sVar116) * sVar48
                    ;
                    auVar112._10_2_ =
                         (ushort)(sVar50 < sVar117) * sVar117 | (ushort)(sVar50 >= sVar117) * sVar50
                    ;
                    auVar112._12_2_ =
                         (ushort)(sVar51 < sVar118) * sVar118 | (ushort)(sVar51 >= sVar118) * sVar51
                    ;
                    auVar112._14_2_ =
                         (ushort)(sVar52 < sVar119) * sVar119 | (ushort)(sVar52 >= sVar119) * sVar52
                    ;
                    auVar90 = pblendvb(auVar90,auVar98,auVar102);
                    auVar41 = paddsw(in_XMM7,_DAT_008d0b80);
                    in_XMM7 = pblendvb(auVar41,auVar97,auVar102);
                    auVar41 = *(undefined1 (*) [16])((long)*ptr + lVar28);
                    auVar97 = *(undefined1 (*) [16])((long)*ptr_04 + lVar28);
                    auVar96 = *(undefined1 (*) [16])((long)*ptr_00 + lVar28);
                    auVar101 = *(undefined1 (*) [16])((long)*ptr_01 + lVar28);
                    lVar28 = lVar28 + 0x10;
                  } while (lVar23 != lVar28);
                  local_158 = ptr_04;
                  auVar94._4_4_ = uVar37;
                  auVar94._0_4_ = uVar37;
                  auVar94._8_4_ = uVar37;
                  auVar94._12_4_ = uVar37;
                  auVar9._4_4_ = uVar38;
                  auVar9._0_4_ = uVar38;
                  auVar9._8_4_ = uVar38;
                  auVar9._12_4_ = uVar38;
                  auVar41 = pmovsxbw(auVar101,0x101010101010101);
                  uVar27 = 0;
                  do {
                    uVar57 = ptr[uVar21][0];
                    uVar19 = (ulong)(uint)(ptr_03[uVar26 + 1] - open);
                    if (ptr_03[uVar26 + 1] - open < -0x7fff) {
                      uVar19 = 0xffff8000;
                    }
                    lVar28 = auVar92._8_8_;
                    uVar54 = auVar92._0_8_;
                    auVar92._0_8_ = uVar54 << 0x10;
                    auVar92._8_8_ = lVar28 << 0x10 | uVar54 >> 0x30;
                    auVar98._8_8_ = ptr[uVar21][1] << 0x10 | uVar57 >> 0x30;
                    auVar98._0_8_ = uVar57 << 0x10 | (ulong)(ushort)ptr_03[uVar26];
                    lVar28 = auVar90._8_8_;
                    uVar57 = auVar90._0_8_;
                    auVar90._0_8_ = uVar57 << 0x10;
                    auVar90._8_8_ = lVar28 << 0x10 | uVar57 >> 0x30;
                    uVar57 = auVar112._0_8_;
                    auVar112._8_8_ = auVar112._8_8_ << 0x10 | uVar57 >> 0x30;
                    auVar112._0_8_ = uVar57 << 0x10 | uVar19 & 0xffff;
                    uVar57 = in_XMM7._0_8_;
                    in_XMM7._8_8_ = in_XMM7._8_8_ << 0x10 | uVar57 >> 0x30;
                    in_XMM7._0_8_ = uVar57 << 0x10 | 1;
                    lVar28 = 0;
                    do {
                      auVar98 = paddsw(auVar98,*(undefined1 (*) [16])
                                                ((long)pvVar5 + lVar28 + lVar29));
                      psVar4 = (short *)((long)*palVar17 + lVar28);
                      sVar52 = *psVar4;
                      sVar100 = psVar4[1];
                      sVar103 = psVar4[2];
                      sVar104 = psVar4[3];
                      sVar105 = psVar4[4];
                      sVar106 = psVar4[5];
                      sVar107 = psVar4[6];
                      sVar108 = psVar4[7];
                      sVar11 = auVar112._0_2_;
                      auVar56._0_2_ =
                           (ushort)(sVar52 < sVar11) * sVar11 | (ushort)(sVar52 >= sVar11) * sVar52;
                      sVar36 = auVar112._2_2_;
                      auVar56._2_2_ =
                           (ushort)(sVar100 < sVar36) * sVar36 |
                           (ushort)(sVar100 >= sVar36) * sVar100;
                      sVar45 = auVar112._4_2_;
                      auVar56._4_2_ =
                           (ushort)(sVar103 < sVar45) * sVar45 |
                           (ushort)(sVar103 >= sVar45) * sVar103;
                      sVar46 = auVar112._6_2_;
                      auVar56._6_2_ =
                           (ushort)(sVar104 < sVar46) * sVar46 |
                           (ushort)(sVar104 >= sVar46) * sVar104;
                      sVar47 = auVar112._8_2_;
                      auVar56._8_2_ =
                           (ushort)(sVar105 < sVar47) * sVar47 |
                           (ushort)(sVar105 >= sVar47) * sVar105;
                      sVar48 = auVar112._10_2_;
                      auVar56._10_2_ =
                           (ushort)(sVar106 < sVar48) * sVar48 |
                           (ushort)(sVar106 >= sVar48) * sVar106;
                      sVar50 = auVar112._12_2_;
                      auVar56._12_2_ =
                           (ushort)(sVar107 < sVar50) * sVar50 |
                           (ushort)(sVar107 >= sVar50) * sVar107;
                      sVar51 = auVar112._14_2_;
                      auVar56._14_2_ =
                           (ushort)(sVar108 < sVar51) * sVar51 |
                           (ushort)(sVar108 >= sVar51) * sVar108;
                      *(undefined1 (*) [16])((long)*palVar17 + lVar28) = auVar56;
                      auVar59._0_2_ = -(ushort)(auVar56._0_2_ == auVar98._0_2_);
                      auVar59._2_2_ = -(ushort)(auVar56._2_2_ == auVar98._2_2_);
                      auVar59._4_2_ = -(ushort)(auVar56._4_2_ == auVar98._4_2_);
                      auVar59._6_2_ = -(ushort)(auVar56._6_2_ == auVar98._6_2_);
                      auVar59._8_2_ = -(ushort)(auVar56._8_2_ == auVar98._8_2_);
                      auVar59._10_2_ = -(ushort)(auVar56._10_2_ == auVar98._10_2_);
                      auVar59._12_2_ = -(ushort)(auVar56._12_2_ == auVar98._12_2_);
                      auVar59._14_2_ = -(ushort)(auVar56._14_2_ == auVar98._14_2_);
                      auVar43._0_2_ = -(ushort)(sVar11 < sVar52);
                      auVar43._2_2_ = -(ushort)(sVar36 < sVar100);
                      auVar43._4_2_ = -(ushort)(sVar45 < sVar103);
                      auVar43._6_2_ = -(ushort)(sVar46 < sVar104);
                      auVar43._8_2_ = -(ushort)(sVar47 < sVar105);
                      auVar43._10_2_ = -(ushort)(sVar48 < sVar106);
                      auVar43._12_2_ = -(ushort)(sVar50 < sVar107);
                      auVar43._14_2_ = -(ushort)(sVar51 < sVar108);
                      auVar43 = auVar43 | auVar59;
                      auVar96 = pblendvb(auVar92,*(undefined1 (*) [16])((long)*b + lVar28),auVar43);
                      *(undefined1 (*) [16])((long)*b + lVar28) = auVar96;
                      auVar101 = pblendvb(auVar90,*(undefined1 (*) [16])((long)*local_198 + lVar28),
                                          auVar43);
                      *(undefined1 (*) [16])((long)*local_198 + lVar28) = auVar101;
                      auVar102 = pblendvb(in_XMM7,*(undefined1 (*) [16])((long)*local_188 + lVar28),
                                          auVar43);
                      *(undefined1 (*) [16])((long)*local_188 + lVar28) = auVar102;
                      auVar97 = psubsw(auVar56,auVar94);
                      auVar99 = psubsw(auVar112,auVar9);
                      auVar44._0_2_ = -(ushort)(auVar99._0_2_ < auVar97._0_2_);
                      auVar44._2_2_ = -(ushort)(auVar99._2_2_ < auVar97._2_2_);
                      auVar44._4_2_ = -(ushort)(auVar99._4_2_ < auVar97._4_2_);
                      auVar44._6_2_ = -(ushort)(auVar99._6_2_ < auVar97._6_2_);
                      auVar44._8_2_ = -(ushort)(auVar99._8_2_ < auVar97._8_2_);
                      auVar44._10_2_ = -(ushort)(auVar99._10_2_ < auVar97._10_2_);
                      auVar44._12_2_ = -(ushort)(auVar99._12_2_ < auVar97._12_2_);
                      auVar44._14_2_ = -(ushort)(auVar99._14_2_ < auVar97._14_2_);
                      uVar58 = ((ushort)(SUB161(auVar44 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar44 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar44 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar44 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar44 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar44 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar44 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar44 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar44 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar44 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar44 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar44 >> 0x6f,0) & 1) << 0xd |
                                (ushort)((byte)(auVar44._14_2_ >> 7) & 1) << 0xe |
                               auVar44._14_2_ & 0x8000) ^ 0xffff;
                      if (uVar58 == 0) {
                        iVar14 = 0x27;
                      }
                      else {
                        auVar92 = pblendvb(auVar92,auVar96,auVar44);
                        auVar90 = pblendvb(auVar90,auVar101,auVar44);
                        auVar112 = paddsw(in_XMM7,auVar41);
                        auVar97 = paddsw(auVar102,auVar41);
                        in_XMM7 = pblendvb(auVar112,auVar97,auVar44);
                        auVar98 = *(undefined1 (*) [16])((long)*ptr + lVar28);
                        iVar14 = 0;
                        auVar112 = auVar99;
                      }
                      uVar70 = ((short)auVar56._0_2_ < (short)uVar70) * auVar56._0_2_ |
                               ((short)auVar56._0_2_ >= (short)uVar70) * uVar70;
                      uVar71 = ((short)auVar56._2_2_ < (short)uVar71) * auVar56._2_2_ |
                               ((short)auVar56._2_2_ >= (short)uVar71) * uVar71;
                      uVar72 = ((short)auVar56._4_2_ < (short)uVar72) * auVar56._4_2_ |
                               ((short)auVar56._4_2_ >= (short)uVar72) * uVar72;
                      uVar73 = ((short)auVar56._6_2_ < (short)uVar73) * auVar56._6_2_ |
                               ((short)auVar56._6_2_ >= (short)uVar73) * uVar73;
                      uVar74 = ((short)auVar56._8_2_ < (short)uVar74) * auVar56._8_2_ |
                               ((short)auVar56._8_2_ >= (short)uVar74) * uVar74;
                      uVar75 = ((short)auVar56._10_2_ < (short)uVar75) * auVar56._10_2_ |
                               ((short)auVar56._10_2_ >= (short)uVar75) * uVar75;
                      uVar76 = ((short)auVar56._12_2_ < (short)uVar76) * auVar56._12_2_ |
                               ((short)auVar56._12_2_ >= (short)uVar76) * uVar76;
                      uVar77 = ((short)auVar56._14_2_ < (short)uVar77) * auVar56._14_2_ |
                               ((short)auVar56._14_2_ >= (short)uVar77) * uVar77;
                      uVar78 = ((short)uVar78 < (short)auVar56._0_2_) * auVar56._0_2_ |
                               ((short)uVar78 >= (short)auVar56._0_2_) * uVar78;
                      uVar79 = ((short)uVar79 < (short)auVar56._2_2_) * auVar56._2_2_ |
                               ((short)uVar79 >= (short)auVar56._2_2_) * uVar79;
                      uVar80 = ((short)uVar80 < (short)auVar56._4_2_) * auVar56._4_2_ |
                               ((short)uVar80 >= (short)auVar56._4_2_) * uVar80;
                      uVar82 = ((short)uVar82 < (short)auVar56._6_2_) * auVar56._6_2_ |
                               ((short)uVar82 >= (short)auVar56._6_2_) * uVar82;
                      uVar83 = ((short)uVar83 < (short)auVar56._8_2_) * auVar56._8_2_ |
                               ((short)uVar83 >= (short)auVar56._8_2_) * uVar83;
                      uVar85 = ((short)uVar85 < (short)auVar56._10_2_) * auVar56._10_2_ |
                               ((short)uVar85 >= (short)auVar56._10_2_) * uVar85;
                      uVar86 = ((short)uVar86 < (short)auVar56._12_2_) * auVar56._12_2_ |
                               ((short)uVar86 >= (short)auVar56._12_2_) * uVar86;
                      uVar88 = ((short)uVar88 < (short)auVar56._14_2_) * auVar56._14_2_ |
                               ((short)uVar88 >= (short)auVar56._14_2_) * uVar88;
                      sVar11 = auVar96._0_2_;
                      uVar78 = (ushort)((short)uVar78 < sVar11) * sVar11 |
                               ((short)uVar78 >= sVar11) * uVar78;
                      sVar11 = auVar96._2_2_;
                      uVar79 = (ushort)((short)uVar79 < sVar11) * sVar11 |
                               ((short)uVar79 >= sVar11) * uVar79;
                      sVar11 = auVar96._4_2_;
                      uVar80 = (ushort)((short)uVar80 < sVar11) * sVar11 |
                               ((short)uVar80 >= sVar11) * uVar80;
                      sVar11 = auVar96._6_2_;
                      uVar82 = (ushort)((short)uVar82 < sVar11) * sVar11 |
                               ((short)uVar82 >= sVar11) * uVar82;
                      sVar11 = auVar96._8_2_;
                      uVar83 = (ushort)((short)uVar83 < sVar11) * sVar11 |
                               ((short)uVar83 >= sVar11) * uVar83;
                      sVar11 = auVar96._10_2_;
                      uVar85 = (ushort)((short)uVar85 < sVar11) * sVar11 |
                               ((short)uVar85 >= sVar11) * uVar85;
                      sVar11 = auVar96._12_2_;
                      uVar86 = (ushort)((short)uVar86 < sVar11) * sVar11 |
                               ((short)uVar86 >= sVar11) * uVar86;
                      sVar11 = auVar96._14_2_;
                      uVar88 = (ushort)((short)uVar88 < sVar11) * sVar11 |
                               ((short)uVar88 >= sVar11) * uVar88;
                      sVar11 = auVar102._0_2_;
                      sVar36 = auVar101._0_2_;
                      uVar81 = (ushort)(sVar36 < sVar11) * sVar11 |
                               (ushort)(sVar36 >= sVar11) * sVar36;
                      sVar11 = auVar102._2_2_;
                      sVar36 = auVar101._2_2_;
                      uVar60 = (ushort)(sVar36 < sVar11) * sVar11 |
                               (ushort)(sVar36 >= sVar11) * sVar36;
                      sVar11 = auVar102._4_2_;
                      sVar36 = auVar101._4_2_;
                      uVar84 = (ushort)(sVar36 < sVar11) * sVar11 |
                               (ushort)(sVar36 >= sVar11) * sVar36;
                      sVar11 = auVar102._6_2_;
                      sVar36 = auVar101._6_2_;
                      uVar61 = (ushort)(sVar36 < sVar11) * sVar11 |
                               (ushort)(sVar36 >= sVar11) * sVar36;
                      sVar11 = auVar102._8_2_;
                      sVar36 = auVar101._8_2_;
                      uVar87 = (ushort)(sVar36 < sVar11) * sVar11 |
                               (ushort)(sVar36 >= sVar11) * sVar36;
                      sVar11 = auVar102._10_2_;
                      sVar36 = auVar101._10_2_;
                      uVar62 = (ushort)(sVar36 < sVar11) * sVar11 |
                               (ushort)(sVar36 >= sVar11) * sVar36;
                      sVar11 = auVar102._12_2_;
                      sVar36 = auVar101._12_2_;
                      sVar45 = auVar101._14_2_;
                      uVar89 = (ushort)(sVar36 < sVar11) * sVar11 |
                               (ushort)(sVar36 >= sVar11) * sVar36;
                      sVar11 = auVar102._14_2_;
                      uVar95 = (ushort)(sVar45 < sVar11) * sVar11 |
                               (ushort)(sVar45 >= sVar11) * sVar45;
                      uVar78 = ((short)uVar81 < (short)uVar78) * uVar78 |
                               ((short)uVar81 >= (short)uVar78) * uVar81;
                      uVar79 = ((short)uVar60 < (short)uVar79) * uVar79 |
                               ((short)uVar60 >= (short)uVar79) * uVar60;
                      uVar80 = ((short)uVar84 < (short)uVar80) * uVar80 |
                               ((short)uVar84 >= (short)uVar80) * uVar84;
                      uVar82 = ((short)uVar61 < (short)uVar82) * uVar82 |
                               ((short)uVar61 >= (short)uVar82) * uVar61;
                      uVar83 = ((short)uVar87 < (short)uVar83) * uVar83 |
                               ((short)uVar87 >= (short)uVar83) * uVar87;
                      uVar85 = ((short)uVar62 < (short)uVar85) * uVar85 |
                               ((short)uVar62 >= (short)uVar85) * uVar62;
                      uVar86 = ((short)uVar89 < (short)uVar86) * uVar86 |
                               ((short)uVar89 >= (short)uVar86) * uVar89;
                      uVar88 = ((short)uVar95 < (short)uVar88) * uVar88 |
                               ((short)uVar95 >= (short)uVar88) * uVar95;
                      if (uVar58 == 0) goto LAB_0068b79d;
                      lVar28 = lVar28 + 0x10;
                    } while (lVar23 != lVar28);
                    iVar14 = 0;
LAB_0068b79d:
                  } while ((iVar14 == 0) && (bVar35 = uVar27 < 7, uVar27 = uVar27 + 1, bVar35));
                  uVar26 = uVar26 + 1;
                  palVar16 = palVar17;
                  b_00 = local_198;
                  b_01 = local_188;
                  if (uVar26 == uVar18) {
                    uVar18 = palVar17[uVar22][0];
                    uVar31 = palVar17[uVar22][1];
                    uVar26 = b[uVar22][0];
                    uVar57 = b[uVar22][1];
                    uVar19 = local_198[uVar22][0];
                    uVar54 = local_198[uVar22][1];
                    uVar39 = local_188[uVar22][0];
                    uVar49 = local_188[uVar22][1];
                    if (iVar25 / iVar30 < 7) {
                      iVar14 = 1;
                      if (1 < iVar13) {
                        iVar14 = iVar13;
                      }
                      do {
                        uVar31 = uVar31 << 0x10 | uVar18 >> 0x30;
                        uVar57 = uVar57 << 0x10 | uVar26 >> 0x30;
                        uVar54 = uVar54 << 0x10 | uVar19 >> 0x30;
                        uVar49 = uVar49 << 0x10 | uVar39 >> 0x30;
                        iVar14 = iVar14 + -1;
                        uVar18 = uVar18 << 0x10;
                        uVar26 = uVar26 << 0x10;
                        uVar19 = uVar19 << 0x10;
                        uVar39 = uVar39 << 0x10;
                      } while (iVar14 != 0);
                    }
                    auVar91._0_2_ = -(ushort)((short)uVar70 < (short)local_c8);
                    auVar91._2_2_ = -(ushort)((short)uVar71 < (short)uStack_c6);
                    auVar91._4_2_ = -(ushort)((short)uVar72 < (short)local_c8);
                    auVar91._6_2_ = -(ushort)((short)uVar73 < (short)uStack_c6);
                    auVar91._8_2_ = -(ushort)((short)uVar74 < (short)local_c8);
                    auVar91._10_2_ = -(ushort)((short)uVar75 < (short)uStack_c6);
                    auVar91._12_2_ = -(ushort)((short)uVar76 < (short)local_c8);
                    auVar91._14_2_ = -(ushort)((short)uVar77 < (short)uStack_c6);
                    auVar40._0_2_ = -(ushort)((short)local_88 < (short)uVar78);
                    auVar40._2_2_ = -(ushort)((short)uStack_86 < (short)uVar79);
                    auVar40._4_2_ = -(ushort)((short)local_88 < (short)uVar80);
                    auVar40._6_2_ = -(ushort)((short)uStack_86 < (short)uVar82);
                    auVar40._8_2_ = -(ushort)((short)local_88 < (short)uVar83);
                    auVar40._10_2_ = -(ushort)((short)uStack_86 < (short)uVar85);
                    auVar40._12_2_ = -(ushort)((short)local_88 < (short)uVar86);
                    auVar40._14_2_ = -(ushort)((short)uStack_86 < (short)uVar88);
                    auVar40 = auVar40 | auVar91;
                    if ((((((((((((((((auVar40 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar40 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar40 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar40 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar40 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar40 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar40 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar40 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar40 >> 0x47 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar40 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar40 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar40 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar40 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar40 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar40 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar40[0xf]) {
                      sVar11 = (short)(uVar31 >> 0x30);
                      sVar36 = (short)(uVar57 >> 0x30);
                      sVar45 = (short)(uVar54 >> 0x30);
                      sVar46 = (short)(uVar49 >> 0x30);
                    }
                    else {
                      *(byte *)&ppVar15->flag = (byte)ppVar15->flag | 0x40;
                      sVar11 = 0;
                      sVar36 = 0;
                      sVar45 = 0;
                      sVar46 = 0;
                      iVar12 = 0;
                      iVar25 = 0;
                    }
                    ppVar15->score = (int)sVar11;
                    ppVar15->end_query = iVar25;
                    ppVar15->end_ref = iVar12;
                    *(int *)(ppVar15->field_4).extra = (int)sVar36;
                    ((ppVar15->field_4).stats)->similar = (int)sVar45;
                    ((ppVar15->field_4).stats)->length = (int)sVar46;
                    parasail_free(ptr_03);
                    parasail_free(b_04);
                    parasail_free(b_03);
                    parasail_free(b_02);
                    parasail_free(ptr_02);
                    parasail_free(ptr_01);
                    parasail_free(local_188);
                    parasail_free(ptr_00);
                    parasail_free(local_198);
                    parasail_free(ptr_04);
                    parasail_free(b);
                    parasail_free(ptr);
                    parasail_free(palVar17);
                    return ppVar15;
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile16.score;
    vProfileM = (__m128i*)profile->profile16.matches;
    vProfileS = (__m128i*)profile->profile16.similar;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop.  */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 2);
        vHM = _mm_slli_si128(vHM, 2);
        vHS = _mm_slli_si128(vHS, 2);
        vHL = _mm_slli_si128(vHL, 2);

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi16(vH_dag, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi16(vH, vH_dag);
            case2 = _mm_cmpeq_epi16(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_adds_epi16(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_adds_epi16(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_adds_epi16(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_subs_epi16(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi16(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_adds_epi16(vEL, vOne),
                    _mm_adds_epi16(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_adds_epi16(vFL, vOne),
                    _mm_adds_epi16(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = boundary[j+1]-open;
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 2);
            vF = _mm_slli_si128(vF, 2);
            vFM = _mm_slli_si128(vFM, 2);
            vFS = _mm_slli_si128(vFS, 2);
            vFL = _mm_slli_si128(vFL, 2);
            vHp = _mm_insert_epi16(vHp, boundary[j], 0);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            vFL = _mm_insert_epi16(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_adds_epi16(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi16(vH, vHp);
                case2 = _mm_cmpeq_epi16(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_subs_epi16(vH, vGapO);
                vF_ext = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi16(vF_ext, vEF_opn),
                                _mm_cmpeq_epi16(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi16(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi16(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_adds_epi16(vFL, vOne),
                        _mm_adds_epi16(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128 (vH, 2);
                vHM = _mm_slli_si128 (vHM, 2);
                vHS = _mm_slli_si128 (vHS, 2);
                vHL = _mm_slli_si128 (vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm_extract_epi16 (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm_extract_epi16 (vHS, 7);
            result->stats->rowcols->length_row[j] = (int16_t) _mm_extract_epi16 (vHL, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 2);
            vHM = _mm_slli_si128 (vHM, 2);
            vHS = _mm_slli_si128 (vHS, 2);
            vHL = _mm_slli_si128 (vHL, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
        matches = (int16_t) _mm_extract_epi16 (vHM, 7);
        similar = (int16_t) _mm_extract_epi16 (vHS, 7);
        length = (int16_t) _mm_extract_epi16 (vHL, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}